

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

void skiwi::compile_cinput_parameters(cinput_data *cinput,environment_map *env,asmcode *code)

{
  operand *poVar1;
  operand *val_1;
  int iVar2;
  long lVar3;
  bool bVar4;
  pointer ppVar5;
  long lVar6;
  operand *poVar7;
  long lVar8;
  uint64_t header;
  string name;
  environment_entry e;
  operand local_f0 [4];
  operation local_e0 [2];
  cinput_data *local_d8;
  ulong local_d0;
  uint local_c8;
  int local_c4;
  string local_c0;
  environment_map *local_a0;
  environment_entry local_98;
  string local_78;
  string local_58;
  long local_38;
  
  ppVar5 = (cinput->parameters).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(cinput->parameters).
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5) >> 3) *
          -0x33333333) {
    local_d0 = 1;
    lVar8 = 0;
    lVar6 = 0;
    local_c4 = 0;
    local_c8 = 0;
    local_d8 = cinput;
    local_a0 = env;
    do {
      poVar7 = local_f0 + 1;
      iVar2 = *(int *)((long)&ppVar5->second + lVar8);
      if (iVar2 == 0) {
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        lVar3 = *(long *)((long)&(ppVar5->first)._M_dataplus + lVar8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c0,lVar3,
                   *(long *)((long)&(ppVar5->first)._M_string_length + lVar8) + lVar3);
        bVar4 = environment<skiwi::environment_entry>::find
                          ((local_a0->
                           super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr,&local_98,&local_c0);
        if (!bVar4 || local_98.st != st_global) {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
          throw_error(invalid_c_input_syntax,&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
        }
        local_e0[0] = ADDSD;
        local_e0[1] = 0x1000000;
        local_f0[2] = 0x40;
        local_f0[1] = 0x18;
        local_f0[0] = RBP;
        poVar1 = local_f0 + 2;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
                  (code,poVar1,poVar7,local_f0);
        local_f0[2] = 0x49;
        local_f0[1] = 0x18;
        local_f0[0] = NUMBER;
        local_f0[3] = 5;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,poVar1,poVar7,local_f0,(int *)(local_f0 + 3));
        local_f0[2] = 0x40;
        local_f0[1] = 9;
        local_f0[0] = NUMBER;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long&>
                  (code,poVar1,poVar7,local_f0,(unsigned_long *)local_e0);
        local_f0[2] = 0x40;
        local_f0[1] = 0x20;
        local_f0[0] = RAX;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
                  (code,poVar1,poVar7,local_f0);
        poVar7 = local_f0 + 3;
        local_38 = lVar6;
        if (local_c8 < 8) {
          val_1 = local_f0 + 1;
          switch(local_c8) {
          case 0:
            local_f0[2] = 0x41;
            local_f0[1] = 0x20;
            local_f0[0] = DH;
            local_f0[3] = 0x43;
            assembler::asmcode::
            add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                      (code,poVar1,val_1,(int *)local_f0,poVar7);
            break;
          case 1:
            local_f0[2] = 0x41;
            local_f0[1] = 0x20;
            local_f0[0] = DH;
            local_f0[3] = 0x44;
            assembler::asmcode::
            add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                      (code,poVar1,val_1,(int *)local_f0,poVar7);
            break;
          case 2:
            local_f0[2] = 0x41;
            local_f0[1] = 0x20;
            local_f0[0] = DH;
            local_f0[3] = 0x45;
            assembler::asmcode::
            add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                      (code,poVar1,val_1,(int *)local_f0,poVar7);
            break;
          case 3:
            local_f0[2] = 0x41;
            local_f0[1] = 0x20;
            local_f0[0] = DH;
            local_f0[3] = 0x46;
            assembler::asmcode::
            add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                      (code,poVar1,val_1,(int *)local_f0,poVar7);
            break;
          case 4:
            local_f0[2] = 0x41;
            local_f0[1] = 0x20;
            local_f0[0] = DH;
            local_f0[3] = 0x47;
            assembler::asmcode::
            add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                      (code,poVar1,val_1,(int *)local_f0,poVar7);
            break;
          case 5:
            local_f0[2] = 0x41;
            local_f0[1] = 0x20;
            local_f0[0] = DH;
            local_f0[3] = 0x48;
            assembler::asmcode::
            add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                      (code,poVar1,val_1,(int *)local_f0,poVar7);
            break;
          case 6:
            local_f0[2] = 0x41;
            local_f0[1] = 0x20;
            local_f0[0] = DH;
            local_f0[3] = 0x49;
            assembler::asmcode::
            add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                      (code,poVar1,val_1,(int *)local_f0,poVar7);
            break;
          case 7:
            local_f0[2] = 0x41;
            local_f0[1] = 0x20;
            local_f0[0] = DH;
            local_f0[3] = 0x4a;
            assembler::asmcode::
            add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                      (code,poVar1,val_1,(int *)local_f0,poVar7);
          }
        }
        else {
          local_f0[2] = 0x40;
          local_f0[1] = 9;
          local_f0[0] = MEM_RSP;
          local_f0[3] = (int)local_d0 * 8;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                    (code,poVar1,local_f0 + 1,local_f0,(int *)poVar7);
          local_f0[2] = 0x40;
          local_f0[1] = 0x20;
          local_f0[0] = DH;
          local_f0[3] = 9;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                    (code,poVar1,local_f0 + 1,(int *)local_f0,local_f0 + 3);
          local_d0 = (ulong)((int)local_d0 + 1);
        }
        local_f0[2] = 0;
        poVar7 = local_f0 + 1;
        local_f0[1] = 0x10;
        local_f0[0] = NUMBER;
        local_f0[3] = 0x10;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,poVar1,poVar7,local_f0,(int *)(local_f0 + 3));
        local_f0[2] = 0x40;
        local_f0[1] = 9;
        local_f0[0] = MEM_R10;
        local_f0[3] = 0xa8;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,poVar1,poVar7,local_f0,(int *)(local_f0 + 3));
        local_f0[2] = 0x40;
        local_f0[1] = 0x19;
        local_f0[0] = R15;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,unsigned_long&,assembler::asmcode::operand>
                  (code,poVar1,poVar7,&local_98.pos,local_f0);
        lVar6 = local_38;
        cinput = local_d8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        local_c8 = local_c8 + 1;
      }
      else if (iVar2 == 1) {
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        lVar3 = *(long *)((long)&(ppVar5->first)._M_dataplus + lVar8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c0,lVar3,
                   *(long *)((long)&(ppVar5->first)._M_string_length + lVar8) + lVar3);
        bVar4 = environment<skiwi::environment_entry>::find
                          ((local_a0->
                           super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr,&local_98,&local_c0);
        poVar1 = local_f0 + 2;
        if (!bVar4 || local_98.st != st_global) {
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
          throw_error(invalid_c_input_syntax,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
        }
        local_e0[0] = MOV;
        local_f0[2] = 9;
        local_f0[1] = 0x23;
        local_f0[0] = 0xa8;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,local_e0,poVar1,poVar7,(int *)local_f0);
        switch(local_c4) {
        case 0:
          local_e0[0] = SHL;
          local_f0[2] = 0xd;
          local_f0[1] = 0x39;
          local_f0[0] = AL;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                    (code,local_e0,poVar1,poVar7,(int *)local_f0);
          local_e0[0] = 0x40;
          local_f0[2] = 0x19;
          local_f0[1] = 0xd;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,unsigned_long&,assembler::asmcode::operand>
                    (code,local_e0,poVar1,&local_98.pos,poVar7);
          break;
        case 1:
          local_e0[0] = SHL;
          local_f0[2] = 0xc;
          local_f0[1] = 0x39;
          local_f0[0] = AL;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                    (code,local_e0,poVar1,poVar7,(int *)local_f0);
          local_e0[0] = 0x40;
          local_f0[2] = 0x19;
          local_f0[1] = 0xc;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,unsigned_long&,assembler::asmcode::operand>
                    (code,local_e0,poVar1,&local_98.pos,poVar7);
          break;
        case 2:
          local_e0[0] = SHL;
          local_f0[2] = 0xb;
          local_f0[1] = 0x39;
          local_f0[0] = AL;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                    (code,local_e0,poVar1,poVar7,(int *)local_f0);
          local_e0[0] = 0x40;
          local_f0[2] = 0x19;
          local_f0[1] = 0xb;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,unsigned_long&,assembler::asmcode::operand>
                    (code,local_e0,poVar1,&local_98.pos,poVar7);
          break;
        case 3:
          local_e0[0] = SHL;
          local_f0[2] = 0x11;
          local_f0[1] = 0x39;
          local_f0[0] = AL;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                    (code,local_e0,poVar1,poVar7,(int *)local_f0);
          local_e0[0] = 0x40;
          local_f0[2] = 0x19;
          local_f0[1] = 0x11;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,unsigned_long&,assembler::asmcode::operand>
                    (code,local_e0,poVar1,&local_98.pos,poVar7);
          break;
        case 4:
          local_e0[0] = SHL;
          local_f0[2] = 0x12;
          local_f0[1] = 0x39;
          local_f0[0] = AL;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                    (code,local_e0,poVar1,poVar7,(int *)local_f0);
          local_e0[0] = 0x40;
          local_f0[2] = 0x19;
          local_f0[1] = 0x12;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,unsigned_long&,assembler::asmcode::operand>
                    (code,local_e0,poVar1,&local_98.pos,poVar7);
          break;
        default:
          local_e0[0] = MOV;
          local_f0[2] = 0xb;
          local_f0[1] = 0x1f;
          local_f0[0] = (int)local_d0 * 8;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                    (code,local_e0,poVar1,poVar7,(int *)local_f0);
          local_e0[0] = SHL;
          local_f0[2] = 0xb;
          local_f0[1] = 0x39;
          local_f0[0] = AL;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                    (code,local_e0,poVar1,poVar7,(int *)local_f0);
          local_e0[0] = 0x40;
          local_f0[2] = 0x19;
          local_f0[1] = 0xb;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,unsigned_long&,assembler::asmcode::operand>
                    (code,local_e0,poVar1,&local_98.pos,poVar7);
          local_d0 = (ulong)((int)local_d0 + 1);
        }
        cinput = local_d8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        local_c4 = local_c4 + 1;
      }
      lVar6 = lVar6 + 1;
      ppVar5 = (cinput->parameters).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x28;
    } while (lVar6 < (int)((ulong)((long)(cinput->parameters).
                                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5)
                          >> 3) * -0x33333333);
  }
  return;
}

Assistant:

void compile_cinput_parameters(cinput_data& cinput, environment_map& env, asmcode& code)
  {
#ifdef _WIN32
  for (int j = 0; j < (int)cinput.parameters.size(); ++j)
    {
    if (cinput.parameters[j].second == cinput_data::cin_int)
      {
      std::string name = cinput.parameters[j].first;

      environment_entry e;
      if (!env->find(e, name) || e.st != environment_entry::st_global)
        throw_error(invalid_c_input_syntax);
      code.add(asmcode::MOV, asmcode::RAX, GLOBALS);
      if (j == 0)
        {
        code.add(asmcode::SHL, asmcode::RDX, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::RDX);
        }
      else if (j == 1)
        {
        code.add(asmcode::SHL, asmcode::R8, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::R8);
        }
      else if (j == 2)
        {
        code.add(asmcode::SHL, asmcode::R9, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::R9);
        }
      else
        {
        int addr = j - 3;
        code.add(asmcode::MOV, asmcode::RCX, asmcode::MEM_RSP, (40 + addr * 8));
        code.add(asmcode::SHL, asmcode::RCX, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::RCX);
        }
      }
    else if (cinput.parameters[j].second == cinput_data::cin_double)
      {
      std::string name = cinput.parameters[j].first;

      environment_entry e;
      if (!env->find(e, name) || e.st != environment_entry::st_global)
        throw_error(invalid_c_input_syntax);

      uint64_t header = make_block_header(1, T_FLONUM);
      code.add(asmcode::MOV, asmcode::R15, ALLOC);
      code.add(asmcode::OR, asmcode::R15, asmcode::NUMBER, block_tag);
      code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, header);
      code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);

      if (j == 0)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM1);
      else if (j == 1)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM2);
      else if (j == 2)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM3);
      else
        {
        int addr = j - 3;
        code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_RSP, (40 + addr * 8));
        code.add(asmcode::MOV, MEM_ALLOC, CELLS(1), asmcode::RAX);
        }

      code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(2));
      code.add(asmcode::MOV, asmcode::RAX, GLOBALS);
      code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::R15);
      }
    }
#else
  int int_index = 0;
  int double_index = 0;
  int rsp_index = 1;
  for (int j = 0; j < (int)cinput.parameters.size(); ++j)
    {
    if (cinput.parameters[j].second == cinput_data::cin_int)
      {
      std::string name = cinput.parameters[j].first;

      environment_entry e;
      if (!env->find(e, name) || e.st != environment_entry::st_global)
        throw_error(invalid_c_input_syntax);
      code.add(asmcode::MOV, asmcode::RAX, GLOBALS);
      if (int_index == 0)
        {
        code.add(asmcode::SHL, asmcode::RSI, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::RSI);
        }
      else if (int_index == 1)
        {
        code.add(asmcode::SHL, asmcode::RDX, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::RDX);
        }
      else if (int_index == 2)
        {
        code.add(asmcode::SHL, asmcode::RCX, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::RCX);
        }
      else if (int_index == 3)
        {
        code.add(asmcode::SHL, asmcode::R8, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::R8);
        }
      else if (int_index == 4)
        {
        code.add(asmcode::SHL, asmcode::R9, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::R9);
        }
      else
        {
        int addr = rsp_index;
        code.add(asmcode::MOV, asmcode::RCX, asmcode::MEM_RSP, 8 * addr);
        code.add(asmcode::SHL, asmcode::RCX, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::RCX);
        ++rsp_index;
        }
      ++int_index;
      }
    else if (cinput.parameters[j].second == cinput_data::cin_double)
      {
      std::string name = cinput.parameters[j].first;

      environment_entry e;
      if (!env->find(e, name) || e.st != environment_entry::st_global)
        throw_error(invalid_c_input_syntax);

      uint64_t header = make_block_header(1, T_FLONUM);
      code.add(asmcode::MOV, asmcode::R15, ALLOC);
      code.add(asmcode::OR, asmcode::R15, asmcode::NUMBER, block_tag);
      code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, header);
      code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);

      if (double_index == 0)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM0);
      else if (double_index == 1)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM1);
      else if (double_index == 2)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM2);
      else if (double_index == 3)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM3);
      else if (double_index == 4)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM4);
      else if (double_index == 5)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM5);
      else if (double_index == 6)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM6);
      else if (double_index == 7)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM7);
      else
        {
        int addr = rsp_index;
        code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_RSP, 8 * addr);
        code.add(asmcode::MOV, MEM_ALLOC, CELLS(1), asmcode::RAX);
        ++rsp_index;
        }

      code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(2));
      code.add(asmcode::MOV, asmcode::RAX, GLOBALS);
      code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::R15);
      ++double_index;
      }
    }
#endif
  }